

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::graph_reduce<signed_char>
          (Omega_h *this,Graph *a2b,Read<signed_char> *b_data,Int width,Omega_h_Op op)

{
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Read<signed_char> local_b8;
  Read<int> local_a8;
  Read<signed_char> local_98;
  Read<int> local_88;
  Write<signed_char> local_78;
  undefined1 local_68 [8];
  Read<signed_char> ab_data;
  undefined1 local_48 [8];
  LOs ab2b;
  LOs a2ab;
  Omega_h_Op op_local;
  Int width_local;
  Read<signed_char> *b_data_local;
  Graph *a2b_local;
  
  Read<int>::Read((Read<int> *)&ab2b.write_.shared_alloc_.direct_ptr,&a2b->a2ab);
  Read<int>::Read((Read<int> *)local_48,&a2b->ab2b);
  Read<int>::Read(&local_88,(Read<int> *)local_48);
  Read<signed_char>::Read(&local_98,b_data);
  unmap<signed_char>((Omega_h *)&local_78,&local_88,&local_98,width);
  read<signed_char>((Omega_h *)local_68,&local_78);
  Write<signed_char>::~Write(&local_78);
  Read<signed_char>::~Read(&local_98);
  Read<int>::~Read(&local_88);
  Read<int>::Read(&local_a8,(Read<int> *)&ab2b.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read(&local_b8,(Read<signed_char> *)local_68);
  fan_reduce<signed_char>(this,&local_a8,&local_b8,width,op);
  Read<signed_char>::~Read(&local_b8);
  Read<int>::~Read(&local_a8);
  Read<signed_char>::~Read((Read<signed_char> *)local_68);
  Read<int>::~Read((Read<int> *)local_48);
  Read<int>::~Read((Read<int> *)&ab2b.write_.shared_alloc_.direct_ptr);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<T> graph_reduce(Graph a2b, Read<T> b_data, Int width, Omega_h_Op op) {
  auto a2ab = a2b.a2ab;
  auto ab2b = a2b.ab2b;
  auto ab_data = read(unmap(ab2b, b_data, width));
  return fan_reduce(a2ab, ab_data, width, op);
}